

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O1

FSerializer * Serialize(FSerializer *arc,char *key,int32_t *value,int32_t *defval)

{
  uint uVar1;
  FWriter *pFVar2;
  char cVar3;
  Value *pVVar4;
  
  pFVar2 = arc->w;
  if (pFVar2 == (FWriter *)0x0) {
    pVVar4 = FReader::FindKey(arc->r,key);
    if (pVVar4 != (Value *)0x0) {
      if ((*(byte *)((long)&pVVar4->data_ + 0x16) & 0x20) == 0) {
        __assert_fail("val->IsInt()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x506,
                      "FSerializer &Serialize(FSerializer &, const char *, int32_t &, int32_t *)");
      }
      *value = (pVVar4->data_).s.length;
    }
  }
  else {
    uVar1 = (pFVar2->mInObject).Count;
    if (uVar1 == 0) {
      cVar3 = '\0';
    }
    else {
      cVar3 = (pFVar2->mInObject).Array[uVar1 - 1];
    }
    if (((defval == (int32_t *)0x0) || (cVar3 == '\0')) || (*value != *defval)) {
      FSerializer::WriteKey(arc,key);
      FWriter::Int(arc->w,*value);
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, int32_t &value, int32_t *defval)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || defval == nullptr || value != *defval)
		{
			arc.WriteKey(key);
			arc.w->Int(value);
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsInt());
			if (val->IsInt())
			{
				value = val->GetInt();
			}
			else
			{
				Printf(TEXTCOLOR_RED "integer type expected for '%s'", key);
				arc.mErrors++;
			}
		}
	}
	return arc;
}